

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O1

bool __thiscall
libtorrent::aux::web_peer_connection::received_invalid_data
          (web_peer_connection *this,piece_index_t index,bool single_peer)

{
  _Atomic_word *p_Var1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *this_00;
  int iVar4;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar5;
  bool bVar6;
  tuple<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  range;
  vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> files;
  int local_40;
  int local_3c;
  vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> local_38;
  
  if ((int)CONCAT71(in_register_00000011,single_peer) == 0) {
    bVar6 = peer_connection::received_invalid_data((peer_connection *)this,index,false);
    return bVar6;
  }
  peVar5 = (this->super_web_connection_base).super_peer_connection.super_peer_connection_hot_members
           .m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->super_web_connection_base).super_peer_connection.super_peer_connection_hot_members
           .m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  this_01 = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar4 = p_Var3->_M_use_count;
      do {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (iVar4 == 0) break;
        LOCK();
        iVar2 = p_Var3->_M_use_count;
        bVar6 = iVar4 == iVar2;
        if (bVar6) {
          p_Var3->_M_use_count = iVar4 + 1;
          iVar2 = iVar4;
        }
        iVar4 = iVar2;
        UNLOCK();
        this_01 = p_Var3;
      } while (!bVar6);
    }
  }
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    peVar5 = (element_type *)0x0;
  }
  else if (this_01->_M_use_count == 0) {
    peVar5 = (element_type *)0x0;
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
    }
  }
  this_00 = (peVar5->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar4 = file_storage::num_files(&this_00->m_files);
  if (iVar4 == 1) {
    bVar6 = peer_connection::received_invalid_data((peer_connection *)this,index,true);
  }
  else {
    iVar4 = file_storage::piece_size(&this_00->m_files,index);
    file_storage::map_block(&local_38,&this_00->m_files,index,0,(long)iVar4);
    if ((long)local_38.
              super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x18) {
      file_piece_range_inclusive
                ((aux *)&local_40,&this_00->m_files,
                 (file_index_t)
                 ((local_38.
                   super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>
                   ._M_impl.super__Vector_impl_data._M_start)->file_index).m_val);
      for (; local_3c != local_40; local_3c = local_3c + 1) {
        peer_connection::incoming_dont_have((peer_connection *)this,(piece_index_t)local_3c);
      }
    }
    else {
      peer_connection::incoming_dont_have((peer_connection *)this,index);
    }
    peer_connection::received_invalid_data((peer_connection *)this,index,true);
    bVar6 = (this->super_web_connection_base).super_peer_connection.m_num_pieces == 0;
    if (local_38.super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.
                      super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return bVar6;
}

Assistant:

bool web_peer_connection::received_invalid_data(piece_index_t const index, bool single_peer)
{
	if (!single_peer) return peer_connection::received_invalid_data(index, single_peer);

	// when a web seed fails a hash check, do the following:
	// 1. if the whole piece only overlaps a single file, mark that file as not
	//    have for this peer
	// 2. if the piece overlaps more than one file, mark the piece as not have
	//    for this peer
	// 3. if it's a single file torrent, just ban it right away
	// this handles the case where web seeds may have some files updated but not other

	auto t = associated_torrent().lock();
	file_storage const& fs = t->torrent_file().files();

	// single file torrent
	if (fs.num_files() == 1) return peer_connection::received_invalid_data(index, single_peer);

	std::vector<file_slice> files = fs.map_block(index, 0, fs.piece_size(index));

	if (files.size() == 1)
	{
		// assume the web seed has a different copy of this specific file
		// than what we expect, and pretend not to have it.
		auto const range = file_piece_range_inclusive(fs, files[0].file_index);
		for (piece_index_t i = std::get<0>(range); i != std::get<1>(range); ++i)
			incoming_dont_have(i);
	}
	else
	{
		incoming_dont_have(index);
	}

	peer_connection::received_invalid_data(index, single_peer);

	// if we don't think we have any of the files, allow banning the web seed
	if (num_have_pieces() == 0) return true;

	// don't disconnect, we won't request anything from this file again
	return false;
}